

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int in_ESI;
  float *in_RDI;
  long *in_FS_OFFSET;
  Float FVar4;
  float fVar5;
  float fVar6;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 in_ZMM2 [64];
  Vector3<float> VVar16;
  Float factor;
  Float sqrtDenom;
  Float F_1;
  Vector3f wh_1;
  Float etap;
  Float cosTheta_i_1;
  Float cosTheta_o_1;
  Float F;
  Vector3f wh;
  Float cosTheta_i;
  Float cosTheta_o;
  float in_stack_fffffffffffffe08;
  Float in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  Float in_stack_fffffffffffffe1c;
  Float in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  TrowbridgeReitzDistribution *in_stack_fffffffffffffe38;
  TrowbridgeReitzDistribution *this_00;
  undefined4 in_stack_fffffffffffffe40;
  TrowbridgeReitzDistribution local_164;
  undefined8 local_158;
  float local_150;
  undefined8 local_148;
  float local_140;
  Tuple3<pbrt::Vector3,_float> local_138 [2];
  _lambda_pbrt__StatsAccumulator___1_ local_119;
  Tuple3<pbrt::Vector3,_float> local_118;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  Tuple3<pbrt::Vector3,_float> local_e8;
  float local_dc;
  Float local_d8;
  float local_d4;
  Tuple3<pbrt::Vector3,_float> local_d0 [2];
  Tuple3<pbrt::Vector3,_float> local_b0;
  Float local_a4;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  float local_64;
  Float local_60;
  int local_5c;
  Tuple3<pbrt::Vector3,_float> local_4c;
  Tuple3<pbrt::Vector3,_float> local_3c;
  Tuple3<pbrt::Vector3,_float> local_30;
  Tuple3<pbrt::Vector3,_float> local_20;
  array<float,_4> local_10;
  undefined1 extraout_var [60];
  undefined1 auVar15 [56];
  
  local_30._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_4c._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  local_5c = in_ESI;
  local_3c._0_8_ = local_4c._0_8_;
  local_20._0_8_ = local_30._0_8_;
  bVar2 = TrowbridgeReitzDistribution::EffectivelySpecular((TrowbridgeReitzDistribution *)0x6a0ebc);
  if (bVar2) {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe0c);
  }
  else {
    bVar2 = SameHemisphere((Vector3f *)&local_20,(Vector3f *)&local_3c);
    if (bVar2) {
      local_60 = AbsCosTheta((Vector3f *)0x6a0f08);
      local_64 = AbsCosTheta((Vector3f *)0x6a0f23);
      auVar15 = extraout_var_00;
      VVar16 = Tuple3<pbrt::Vector3,float>::operator+
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_78 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar7._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar15;
      local_80 = vmovlpd_avx(auVar7._0_16_);
      local_70 = local_80;
      local_68 = local_78;
      if (((local_64 == 0.0) && (!NAN(local_64))) || ((local_60 == 0.0 && (!NAN(local_60))))) {
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe0c);
      }
      else {
        local_70._0_4_ = (float)local_80;
        if (((float)local_70 == 0.0) && (!NAN((float)local_70))) {
          local_70._4_4_ = (float)((ulong)local_80 >> 0x20);
          if ((local_70._4_4_ == 0.0) &&
             (((!NAN(local_70._4_4_) && (local_78 == 0.0)) && (!NAN(local_78))))) {
            SampledSpectrum::SampledSpectrum
                      ((SampledSpectrum *)
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe0c);
            return (SampledSpectrum)(array<float,_4>)local_10.values;
          }
        }
        auVar15 = (undefined1  [56])0x0;
        VVar16 = Normalize<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        local_98 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar8._8_56_ = auVar15;
        local_a0 = vmovlpd_avx(auVar8._0_16_);
        auVar15 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
        local_90 = local_a0;
        local_88 = local_98;
        local_70 = local_a0;
        local_68 = local_98;
        Vector3<float>::Vector3
                  ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,0.0);
        VVar16 = FaceForward<float>((Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                    (Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        local_d0[0].z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar9._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar9._8_56_ = auVar15;
        local_d0[0]._0_8_ = vmovlpd_avx(auVar9._0_16_);
        local_b0._0_8_ = local_d0[0]._0_8_;
        local_b0.z = local_d0[0].z;
        Dot<float>((Vector3<float> *)&local_3c,(Vector3<float> *)&local_b0);
        local_a4 = FrDielectric(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        TrowbridgeReitzDistribution::D
                  (in_stack_fffffffffffffe38,
                   (Vector3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        TrowbridgeReitzDistribution::G
                  ((TrowbridgeReitzDistribution *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (Vector3f *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (Vector3f *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        SampledSpectrum::SampledSpectrum
                  ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe0c);
      }
    }
    else {
      local_d4 = CosTheta((Vector3f *)&local_20);
      local_d8 = CosTheta((Vector3f *)&local_3c);
      if (((local_d8 == 0.0) && (!NAN(local_d8))) || ((local_d4 == 0.0 && (!NAN(local_d4))))) {
        memset(&local_10,0,0x10);
        SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a11e9);
      }
      else {
        FVar4 = CosTheta((Vector3f *)&local_20);
        if (FVar4 <= 0.0) {
          fVar5 = 1.0 / *in_RDI;
        }
        else {
          fVar5 = *in_RDI;
        }
        auVar15 = (undefined1  [56])0x0;
        local_dc = fVar5;
        VVar16 = Tuple3<pbrt::Vector3,float>::operator*
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            in_stack_fffffffffffffe1c);
        local_100 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar10._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar15;
        local_108 = vmovlpd_avx(auVar10._0_16_);
        local_f8 = local_108;
        local_f0 = local_100;
        VVar16 = Tuple3<pbrt::Vector3,float>::operator+
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        local_118.z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar11._8_56_ = auVar15;
        local_118._0_8_ = vmovlpd_avx(auVar11._0_16_);
        local_e8._0_8_ = local_118._0_8_;
        local_e8.z = local_118.z;
        if ((f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') &&
           (iVar3 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                         ::reg), iVar3 != 0)) {
          f(pbrt::Vector3,pbrt::Vector3,pbrt::TransportMode)_const::
          {lambda(pbrt::StatsAccumulator&)#1}::operator_cast_to_function_pointer(&local_119);
          StatRegisterer::StatRegisterer
                    ((StatRegisterer *)CONCAT44(fVar5,in_stack_fffffffffffffe40),
                     (AccumFunc)in_stack_fffffffffffffe38,
                     (PixelAccumFunc)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg
                             );
        }
        *(long *)(*in_FS_OFFSET + -0x570) = *(long *)(*in_FS_OFFSET + -0x570) + 1;
        fVar5 = LengthSquared<float>((Vector3<float> *)&local_e8);
        if ((fVar5 == 0.0) && (!NAN(fVar5))) {
          *(long *)(*in_FS_OFFSET + -0x578) = *(long *)(*in_FS_OFFSET + -0x578) + 1;
        }
        fVar5 = LengthSquared<float>((Vector3<float> *)&local_e8);
        if ((fVar5 != 0.0) || (NAN(fVar5))) {
          auVar15 = extraout_var_01;
          VVar16 = Normalize<float>((Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          local_150 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar12._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar12._8_56_ = auVar15;
          local_158 = vmovlpd_avx(auVar12._0_16_);
          this_00 = &local_164;
          auVar15 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
          local_148 = local_158;
          local_140 = local_150;
          Normal3<float>::Normal3
                    ((Normal3<float> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                     ,in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,0.0);
          VVar16 = FaceForward<float>((Vector3<float> *)
                                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                      (Normal3<float> *)
                                      CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
          ;
          local_138[0].z = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar13._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar13._8_56_ = auVar15;
          local_138[0]._0_8_ = vmovlpd_avx(auVar13._0_16_);
          local_e8._0_8_ = local_138[0]._0_8_;
          local_e8.z = local_138[0].z;
          fVar5 = Dot<float>((Vector3<float> *)&local_3c,(Vector3<float> *)&local_e8);
          fVar6 = Dot<float>((Vector3<float> *)&local_20,(Vector3<float> *)&local_e8);
          if (fVar5 * fVar6 <= 0.0) {
            Dot<float>((Vector3<float> *)&local_20,(Vector3<float> *)&local_e8);
            FrDielectric(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
            fVar6 = Dot<float>((Vector3<float> *)&local_20,(Vector3<float> *)&local_e8);
            fVar5 = local_dc;
            auVar14._0_4_ = Dot<float>((Vector3<float> *)&local_3c,(Vector3<float> *)&local_e8);
            auVar14._4_60_ = extraout_var;
            auVar1 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)fVar5),ZEXT416((uint)fVar6));
            if (local_5c == 0) {
              Sqr<float>(1.0 / local_dc);
            }
            FVar4 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)CONCAT44(fVar5,fVar6));
            TrowbridgeReitzDistribution::G
                      ((TrowbridgeReitzDistribution *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (Vector3f *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                       (Vector3f *)CONCAT44(FVar4,in_stack_fffffffffffffe10));
            AbsDot<float>((Vector3<float> *)CONCAT44(FVar4,in_stack_fffffffffffffe10),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            iVar3 = (int)&local_20;
            AbsDot<float>((Vector3<float> *)CONCAT44(FVar4,in_stack_fffffffffffffe10),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            Sqr<float>(auVar1._0_4_);
            std::abs(iVar3);
            SampledSpectrum::SampledSpectrum
                      ((SampledSpectrum *)CONCAT44(FVar4,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe0c);
          }
          else {
            memset(&local_10,0,0x10);
            SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a14ec);
          }
        }
        else {
          memset(&local_10,0,0x10);
          SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a13bf);
        }
      }
    }
  }
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (mfDistrib.EffectivelySpecular())
            return SampledSpectrum(0);
        if (SameHemisphere(wo, wi)) {
            // Compute reflection at non-delta dielectric interface
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            Vector3f wh = wi + wo;
            // Handle degenerate cases for microfacet reflection
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return SampledSpectrum(0.);
            if (wh.x == 0 && wh.y == 0 && wh.z == 0)
                return SampledSpectrum(0.);
            wh = Normalize(wh);
            Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
            return SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                   (4 * cosTheta_i * cosTheta_o));

        } else {
            // Compute transmission at non-delta dielectric interface
            Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wh = wo + wi * etap;
            CHECK_RARE(1e-6, LengthSquared(wh) == 0);
            if (LengthSquared(wh) == 0)
                return {};
            wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

            // both on same side?
            if (Dot(wi, wh) * Dot(wo, wh) > 0)
                return {};

            Float F = FrDielectric(Dot(wo, wh), eta);
            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
            return SampledSpectrum((1 - F) * factor *
                                   std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                            AbsDot(wi, wh) * AbsDot(wo, wh) /
                                            (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
        }
    }